

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsources.cpp
# Opt level: O0

void __thiscall
jrtplib::RTPSources::Timeout(RTPSources *this,RTPTime *curtime,RTPTime *timeoutdelay)

{
  RTPTime obj;
  bool bVar1;
  RTPInternalSourceData **ppRVar2;
  RTPMemoryManager *mgr;
  RTPTime local_48;
  RTPTime lastmsgtime;
  RTPInternalSourceData *srcdat;
  RTPTime checktime;
  int local_28;
  int newactivecount;
  int newsendercount;
  int newtotalcount;
  RTPTime *timeoutdelay_local;
  RTPTime *curtime_local;
  RTPSources *this_local;
  
  newactivecount = 0;
  local_28 = 0;
  checktime.m_t._4_4_ = 0;
  srcdat = (RTPInternalSourceData *)curtime->m_t;
  RTPTime::operator-=((RTPTime *)&srcdat,timeoutdelay);
  RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPInternalSourceData_*,_jrtplib::RTPSources_GetHashIndex,_8317>
  ::GotoFirstElement(&this->sourcelist);
  while (bVar1 = RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPInternalSourceData_*,_jrtplib::RTPSources_GetHashIndex,_8317>
                 ::HasCurrentElement(&this->sourcelist), bVar1) {
    ppRVar2 = RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPInternalSourceData_*,_jrtplib::RTPSources_GetHashIndex,_8317>
              ::GetCurrentElement(&this->sourcelist);
    lastmsgtime.m_t = (double)*ppRVar2;
    local_48 = RTPSourceData::INF_GetLastMessageTime((RTPSourceData *)lastmsgtime.m_t);
    if (((RTPInternalSourceData *)lastmsgtime.m_t == this->owndata) ||
       (bVar1 = RTPTime::operator<(&local_48,(RTPTime *)&srcdat), !bVar1)) {
      newactivecount = newactivecount + 1;
      bVar1 = RTPSourceData::IsSender((RTPSourceData *)lastmsgtime.m_t);
      if (bVar1) {
        local_28 = local_28 + 1;
      }
      bVar1 = RTPSourceData::IsActive((RTPSourceData *)lastmsgtime.m_t);
      if (bVar1) {
        checktime.m_t._4_4_ = checktime.m_t._4_4_ + 1;
      }
      RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPInternalSourceData_*,_jrtplib::RTPSources_GetHashIndex,_8317>
      ::GotoNextElement(&this->sourcelist);
    }
    else {
      this->totalcount = this->totalcount + -1;
      bVar1 = RTPSourceData::IsSender((RTPSourceData *)lastmsgtime.m_t);
      if (bVar1) {
        this->sendercount = this->sendercount + -1;
      }
      bVar1 = RTPSourceData::IsActive((RTPSourceData *)lastmsgtime.m_t);
      if (bVar1) {
        this->activecount = this->activecount + -1;
      }
      RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPInternalSourceData_*,_jrtplib::RTPSources_GetHashIndex,_8317>
      ::DeleteCurrentElement(&this->sourcelist);
      (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[8])(this,lastmsgtime.m_t);
      (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[7])(this,lastmsgtime.m_t);
      obj = lastmsgtime;
      mgr = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
      RTPDelete<jrtplib::RTPInternalSourceData>((RTPInternalSourceData *)obj.m_t,mgr);
    }
  }
  this->totalcount = newactivecount;
  this->sendercount = local_28;
  this->activecount = checktime.m_t._4_4_;
  return;
}

Assistant:

void RTPSources::Timeout(const RTPTime &curtime,const RTPTime &timeoutdelay)
{
	int newtotalcount = 0;
	int newsendercount = 0;
	int newactivecount = 0;
	RTPTime checktime = curtime;
	checktime -= timeoutdelay;
	
	sourcelist.GotoFirstElement();
	while (sourcelist.HasCurrentElement())
	{
		RTPInternalSourceData *srcdat = sourcelist.GetCurrentElement();
		RTPTime lastmsgtime = srcdat->INF_GetLastMessageTime();

		// we don't want to time out ourselves
		if ((srcdat != owndata) && (lastmsgtime < checktime)) // timeout
		{
			
			totalcount--;
			if (srcdat->IsSender())
				sendercount--;
			if (srcdat->IsActive())
				activecount--;
			
			sourcelist.DeleteCurrentElement();

			OnTimeout(srcdat);
			OnRemoveSource(srcdat);
			RTPDelete(srcdat,GetMemoryManager());
		}
		else
		{
			newtotalcount++;
			if (srcdat->IsSender())
				newsendercount++;
			if (srcdat->IsActive())
				newactivecount++;
			sourcelist.GotoNextElement();
		}
	}
	
#ifdef RTPDEBUG
	if (newtotalcount != totalcount)
	{
		std::cout << "New total count " << newtotalcount << " doesnt match old total count " << totalcount << std::endl;
		SafeCountTotal();
	}
	if (newsendercount != sendercount)
	{
		std::cout << "New sender count " << newsendercount << " doesnt match old sender count " << sendercount << std::endl;
		SafeCountSenders();
	}
	if (newactivecount != activecount)
	{
		std::cout << "New active count " << newactivecount << " doesnt match old active count " << activecount << std::endl;
		SafeCountActive();
	}
#endif // RTPDEBUG
	
	totalcount = newtotalcount; // just to play it safe
	sendercount = newsendercount;
	activecount = newactivecount;
}